

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * soul::Value::zeroInitialiser(Value *__return_storage_ptr__,Type *t)

{
  Type local_20;
  
  if ((t->category != invalid) && ((t->primitiveType).type != void_)) {
    local_20.category = t->category;
    local_20.arrayElementCategory = t->arrayElementCategory;
    local_20.isRef = t->isRef;
    local_20.isConstant = t->isConstant;
    local_20.primitiveType.type = (t->primitiveType).type;
    local_20.boundingSize = t->boundingSize;
    local_20.arrayElementBoundingSize = t->arrayElementBoundingSize;
    local_20.structure.object = (t->structure).object;
    (t->structure).object = (Structure *)0x0;
    Value(__return_storage_ptr__,&local_20);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_20.structure.object);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("t.isValid() && ! t.isVoid()","zeroInitialiser",0x207);
}

Assistant:

StringDictionary::Handle getStringLiteral() const
    {
        SOUL_ASSERT (type.isStringLiteral());
        return getAs<StringDictionary::Handle>();
    }